

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

void __thiscall Clasp::Solver::undoLevel(Solver *this,bool sp)

{
  size_type *psVar1;
  ConstraintDB *pCVar2;
  Constraint *pCVar3;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *this_00;
  ulong uVar4;
  ulong uVar5;
  ConstraintDB *local_28;
  
  Assignment::undoTrail
            (&this->assign_,
             *(uint *)((this->levels_).super_type.ebo_.buf +
                      ((this->levels_).super_type.ebo_.size - 1)) & 0x3fffffff,sp);
  pCVar2 = (this->levels_).super_type.ebo_.buf[(this->levels_).super_type.ebo_.size - 1].undo;
  if (pCVar2 != (ConstraintDB *)0x0) {
    uVar5 = (ulong)(pCVar2->ebo_).size;
    if (uVar5 != 0) {
      uVar4 = 0;
      do {
        pCVar3 = (pCVar2->ebo_).buf[uVar4];
        (*pCVar3->_vptr_Constraint[3])(pCVar3,this);
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    this_00 = (this->levels_).super_type.ebo_.buf[(this->levels_).super_type.ebo_.size - 1].undo;
    (this_00->ebo_).size = 0;
    local_28 = this->undoHead_;
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
              (this_00,(Constraint **)&local_28);
    this->undoHead_ = this_00;
  }
  psVar1 = &(this->levels_).super_type.ebo_.size;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void Solver::undoLevel(bool sp) {
	assert(decisionLevel() != 0 && levels_.back().trailPos != assign_.trail.size() && "Decision Level must not be empty");
	assign_.undoTrail(levels_.back().trailPos, sp);
	if (levels_.back().undo) {
		const ConstraintDB& undoList = *levels_.back().undo;
		for (ConstraintDB::size_type i = 0, end = undoList.size(); i != end; ++i) {
			undoList[i]->undoLevel(*this);
		}
		undoFree(levels_.back().undo);
	}
	levels_.pop_back();
}